

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

float recall_tree_ns::train_node(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  float fVar1;
  double dVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  node *pnVar5;
  uint in_ECX;
  learner<char,_example> *in_RDX;
  example *in_RSI;
  long in_RDI;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float save_scalar;
  float imp_weight;
  float route_label;
  double delta_right;
  double delta_left;
  double nr;
  double nl;
  double old_right;
  double old_left;
  double new_right;
  double new_left;
  uint32_t save_pred;
  label_t mc;
  learner<char,_example> *i;
  example *in_stack_ffffffffffffff38;
  learner<char,_example> *in_stack_ffffffffffffff40;
  learner<char,_example> *this;
  undefined4 local_84;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float fStack_20;
  
  uVar4 = *(undefined8 *)(in_RDX + 0x6828);
  uVar3 = *(undefined4 *)(in_RDX + 0x6850);
  v_array<recall_tree_ns::node>::operator[]
            ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  dVar6 = updated_entropy((recall_tree *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c,
                          (example *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  v_array<recall_tree_ns::node>::operator[]
            ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  dVar7 = updated_entropy((recall_tree *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c,
                          (example *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)pnVar5->left);
  dVar9 = pnVar5->entropy;
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)pnVar5->right);
  dVar2 = pnVar5->entropy;
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)pnVar5->left);
  dVar8 = pnVar5->n;
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  pnVar5 = v_array<recall_tree_ns::node>::operator[]
                     ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)pnVar5->right);
  fStack_20 = (float)((ulong)uVar4 >> 0x20);
  dVar8 = dVar8 * (dVar6 - dVar9) + (double)fStack_20 * dVar6;
  dVar9 = pnVar5->n * (dVar7 - dVar2) + (double)fStack_20 * dVar7;
  local_84 = 0xbf800000;
  if (dVar9 <= dVar8) {
    local_84 = 0x3f800000;
  }
  dVar8 = dVar8 - dVar9;
  dVar9 = std::fabs((double)CONCAT44((int)((ulong)dVar8 >> 0x20),(float)dVar8));
  *(ulong *)(in_RDX + 0x6828) = CONCAT44(SUB84(dVar9,0),local_84);
  *(undefined4 *)(in_RDX + 0x6830) = 0;
  i = in_RDX;
  v_array<recall_tree_ns::node>::operator[]
            ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  LEARNER::learner<char,_example>::learn
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(size_t)i);
  this = in_RDX;
  v_array<recall_tree_ns::node>::operator[]
            ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(ulong)in_ECX);
  LEARNER::learner<char,_example>::predict(this,in_RSI,(size_t)i);
  fVar1 = *(float *)(in_RDX + 0x6850);
  *(undefined8 *)(in_RDX + 0x6828) = uVar4;
  *(undefined4 *)(in_RDX + 0x6850) = uVar3;
  return fVar1;
}

Assistant:

float train_node(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  // minimize entropy
  // better than maximize expected likelihood, and the proofs go through :)
  double new_left = updated_entropy(b, b.nodes[cn].left, ec);
  double new_right = updated_entropy(b, b.nodes[cn].right, ec);
  double old_left = b.nodes[b.nodes[cn].left].entropy;
  double old_right = b.nodes[b.nodes[cn].right].entropy;
  double nl = b.nodes[b.nodes[cn].left].n;
  double nr = b.nodes[b.nodes[cn].right].n;
  double delta_left = nl * (new_left - old_left) + mc.weight * new_left;
  double delta_right = nr * (new_right - old_right) + mc.weight * new_right;
  float route_label = delta_left < delta_right ? -1.f : 1.f;
  float imp_weight = fabs((float)(delta_left - delta_right));

  ec.l.simple = {route_label, imp_weight, 0.};
  base.learn(ec, b.nodes[cn].base_router);

  // TODO: using the updated routing seems to help
  // TODO: consider faster version using updated_prediction
  // TODO: (doesn't play well with link function)
  base.predict(ec, b.nodes[cn].base_router);

  float save_scalar = ec.pred.scalar;

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return save_scalar;
}